

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.cpp
# Opt level: O2

void handle_terminate(void)

{
  undefined8 uVar1;
  char *__s;
  long *plVar2;
  int extraout_EDX;
  exception_ptr p;
  exception_ptr local_28;
  exception_ptr local_20;
  
  puts("\nuncaught exception terminate handler called!");
  fflush(_stdout);
  std::current_exception();
  if (local_28._M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::exception_ptr(&local_20,&local_28);
    uVar1 = std::rethrow_exception((exception_ptr)&local_20);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_20);
    plVar2 = (long *)__cxa_begin_catch(uVar1);
    if (extraout_EDX == 2) {
      __s = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
      puts(__s);
      fflush(_stdout);
      __cxa_end_catch();
    }
    else {
      puts("caught an unknown exception in custom terminate handler.");
      __cxa_end_catch();
    }
  }
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_28);
  return;
}

Assistant:

void handle_terminate()
{
    printf( "\nuncaught exception terminate handler called!\n" );
    fflush(stdout);

    std::exception_ptr p = std::current_exception();

    if( p )
    {
        try
        {
            std::rethrow_exception( p );
        }
        catch(std::exception& ex)
        {
            printf("%s\n",ex.what());
            fflush(stdout);
        }
        catch(...)
        {
            printf("caught an unknown exception in custom terminate handler.\n");
        }
    }
}